

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O1

void __thiscall cmProcess::~cmProcess(cmProcess *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer pcVar3;
  pointer pcVar4;
  
  ppcVar2 = (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->ProcessArgs).
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2)
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Arguments);
  pcVar3 = (this->WorkingDirectory)._M_dataplus._M_p;
  paVar1 = &(this->WorkingDirectory).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->Command)._M_dataplus._M_p;
  paVar1 = &(this->Command).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->Output).super_vector<char,_std::allocator<char>_>.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4,(long)(this->Output).super_vector<char,_std::allocator<char>_>.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar4);
  }
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr(&this->Runner);
  pcVar4 = (this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4,(long)(this->Buf).super__Vector_base<char,_std::allocator<char>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pcVar4);
  }
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_timer_s> *)&this->Timer);
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&this->PipeReader);
  ::cm::uv_handle_ptr_base_<uv_process_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_process_s> *)&this->Process);
  return;
}

Assistant:

cmProcess::~cmProcess() = default;